

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O0

void __thiscall
solitaire::events::EventsProcessorTests_ignoreLeftButtonDownEventAndStopProcessingWhenNoEvents_Test
::~EventsProcessorTests_ignoreLeftButtonDownEventAndStopProcessingWhenNoEvents_Test
          (EventsProcessorTests_ignoreLeftButtonDownEventAndStopProcessingWhenNoEvents_Test *this)

{
  EventsProcessorTests_ignoreLeftButtonDownEventAndStopProcessingWhenNoEvents_Test *this_local;
  
  ~EventsProcessorTests_ignoreLeftButtonDownEventAndStopProcessingWhenNoEvents_Test(this);
  operator_delete(this,0xf20);
  return;
}

Assistant:

TEST_F(EventsProcessorTests,
       ignoreLeftButtonDownEventAndStopProcessingWhenNoEvents)
{
    expectEvent(mouseLeftButtonDownEvent);
    ignoreLeftButtonDownOnButtons();
    ignoreLeftButtonDownOnFoundationPilesFromFirstTo(foundationPilesCount);
    ignoreLeftButtonDownOnTableauPilesFromFirstTo(tableauPilesCount);
    ignoreLeftButtonDownOnStockPile();
    expectEvent(NoEvents {});
    eventsProcessor.processEvents();
    EXPECT_FALSE(eventsProcessor.shouldQuit());
}